

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

int __thiscall HTTPRequest::parse_request_line(HTTPRequest *this,char *str,ssize_t size)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  
  lVar2 = 0;
  lVar1 = 0;
  if (0 < size) {
    lVar1 = size;
  }
  for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    if (str[lVar2] == ' ') {
      std::__cxx11::string::assign((char *)this,(ulong)str);
      lVar1 = lVar2;
      break;
    }
  }
  pcVar4 = str + lVar1 + 1;
  lVar2 = size - (lVar1 + 1);
  lVar3 = 0;
  lVar1 = 0;
  if (0 < lVar2) {
    lVar1 = lVar2;
  }
  do {
    if (lVar1 == lVar3) {
LAB_00106788:
      std::__cxx11::string::assign((char *)&this->version,(ulong)(pcVar4 + lVar1 + 1));
      return 0;
    }
    if (pcVar4[lVar3] == ' ') {
      std::__cxx11::string::assign((char *)&this->uri,(ulong)pcVar4);
      lVar1 = lVar3;
      goto LAB_00106788;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int HTTPRequest::parse_request_line(const char *str, ssize_t size) {
    // TODO
    ssize_t i = size;
    for (i = 0; i < size; i++) {
        if (str[i] == ' ') {
            this->method.assign(str, i * sizeof(char));
            break;
        }
    }
    i++;
    str += i;
    size -= i;
    for (i = 0; i < size; i++) {
        if (str[i] == ' ') {
            this->uri.assign(str, i * sizeof(char));
            break;
        }
    }
    i++;
    str += i;
    size -= i;
    this->version.assign(str, size * sizeof(char));
    return 0;
}